

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O0

btMatrixX<float> * __thiscall btMatrixX<float>::transpose(btMatrixX<float> *this)

{
  btMatrixX<float> *in_RSI;
  btMatrixX<float> *in_RDI;
  float v;
  int j;
  int i;
  btMatrixX<float> *tr;
  int in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  btMatrixX<float> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar1;
  int local_28;
  
  btMatrixX((btMatrixX<float> *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            (int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  setZero(in_RSI);
  for (local_28 = 0; local_28 < in_RSI->m_cols; local_28 = local_28 + 1) {
    for (iVar1 = 0; iVar1 < in_RSI->m_rows; iVar1 = iVar1 + 1) {
      in_stack_ffffffffffffffb0 =
           (btMatrixX<float> *)
           operator()(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8)
      ;
      if (((float)in_stack_ffffffffffffffb0->m_rows != 0.0) ||
         (NAN((float)in_stack_ffffffffffffffb0->m_rows))) {
        setElem(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,0.0);
      }
    }
  }
  return in_RDI;
}

Assistant:

btMatrixX transpose() const
	{
		//transpose is optimized for sparse matrices
		btMatrixX tr(m_cols,m_rows);
		tr.setZero();
		for (int i=0;i<m_cols;i++)
			for (int j=0;j<m_rows;j++)
			{
				T v = (*this)(j,i);
				if (v)
				{
					tr.setElem(i,j,v);
				}
			}
		return tr;
	}